

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall cmComputeLinkInformation::AddImplicitLinkInfo(cmComputeLinkInformation *this)

{
  size_t __n;
  int iVar1;
  LinkClosure *pLVar2;
  pointer pbVar3;
  pointer lang;
  
  pLVar2 = cmTarget::GetLinkClosure(this->Target,&this->Config);
  lang = (pLVar2->Languages).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (pLVar2->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (lang != pbVar3) {
    do {
      __n = lang->_M_string_length;
      if ((__n != (this->LinkLanguage)._M_string_length) ||
         ((__n != 0 &&
          (iVar1 = bcmp((lang->_M_dataplus)._M_p,(this->LinkLanguage)._M_dataplus._M_p,__n),
          iVar1 != 0)))) {
        AddImplicitLinkInfo(this,lang);
        pbVar3 = (pLVar2->Languages).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      lang = lang + 1;
    } while (lang != pbVar3);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddImplicitLinkInfo()
{
  // The link closure lists all languages whose implicit info is needed.
  cmTarget::LinkClosure const* lc=this->Target->GetLinkClosure(this->Config);
  for(std::vector<std::string>::const_iterator li = lc->Languages.begin();
      li != lc->Languages.end(); ++li)
    {
    // Skip those of the linker language.  They are implicit.
    if(*li != this->LinkLanguage)
      {
      this->AddImplicitLinkInfo(*li);
      }
    }
}